

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O2

void __thiscall ThrowStatement::GenerateCode(ThrowStatement *this,ostream *out,int n)

{
  ostream *poVar1;
  indent local_4c;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  int local_28;
  
  local_4c._n = n;
  poVar1 = operator<<(out,&local_4c);
  poVar1 = std::operator<<(poVar1,"throw ");
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &(this->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_38,&local_48);
  local_28 = n;
  (*(local_38._M_ptr)->_vptr_Expression[1])(local_38._M_ptr,poVar1,(ulong)(uint)n);
  poVar1 = std::operator<<(poVar1,';');
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		out << ::indent(n) << "throw " << expression_out(m_Expression, n) << ';' << std::endl;
	}